

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::GetKeyBirthTimes
          (CWallet *this,
          map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
          *mapKeyBirth)

{
  uint uVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  Chain *pCVar4;
  TxStateConfirmed *pTVar5;
  undefined8 uVar6;
  int iVar7;
  LegacyScriptPubKeyMan *pLVar8;
  mapped_type_conflict1 *pmVar9;
  _Base_ptr p_Var10;
  const_iterator cVar11;
  mapped_type *ppTVar12;
  iterator iVar13;
  _Hash_node_base *p_Var14;
  CKeyID *keyid;
  undefined1 __k [8];
  _Hash_node_base *p_Var15;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock57;
  map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  mapKeyFirstBlock;
  bool local_109;
  undefined1 local_108 [8];
  TxStateConfirmed *pTStack_100;
  _Base_ptr p_Stack_f8;
  _Base_ptr p_Stack_f0;
  _Base_ptr p_Stack_e8;
  size_t local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  _Rb_tree_node_base local_b8;
  TxStateConfirmed local_98;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>,_std::_Select1st<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
  ::clear(&mapKeyBirth->_M_t);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_98.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_98.confirmed_block_height = -1;
  local_98.position_in_block = -1;
  uVar1 = this->m_last_block_processed_height;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)uVar1 < 0) {
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
  }
  local_98.confirmed_block_height = uVar1 - 0x90;
  if (uVar1 < 0x90) {
    local_98.confirmed_block_height = 0;
  }
  local_98.position_in_block = -1;
  if (this->m_chain != (Chain *)0x0) {
    local_b8._0_8_ =
         *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
    local_b8._M_parent =
         *(_Base_ptr *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
    local_b8._M_left._0_4_ =
         *(undefined4 *)
          ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
    local_b8._M_left._4_4_ =
         *(undefined4 *)
          ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x14);
    local_b8._M_right._0_4_ =
         *(undefined4 *)
          ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
    local_b8._M_right._4_4_ =
         *(undefined4 *)
          ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x1c);
    local_d0 = 0;
    uStack_c8 = 0;
    local_e0 = 0;
    uStack_d8 = 0;
    p_Stack_f0 = (_Base_ptr)0x0;
    p_Stack_e8 = (_Base_ptr)0x0;
    pTStack_100 = (TxStateConfirmed *)0x0;
    p_Stack_f8 = (_Rb_tree_node_base *)0x0;
    local_c0 = 0;
    local_108 = (undefined1  [8])&local_98;
    iVar7 = (*this->m_chain->_vptr_Chain[0xc])();
    local_109 = SUB41(iVar7,0);
    inline_check_non_fatal<bool>
              (&local_109,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
               ,0xac6,"GetKeyBirthTimes",
               "chain().findAncestorByHeight(GetLastBlockHash(), max_confirm.confirmed_block_height, FoundBlock().hash(max_confirm.confirmed_block_hash))"
              );
    pLVar8 = GetLegacyScriptPubKeyMan(this);
    if (pLVar8 == (LegacyScriptPubKeyMan *)0x0) {
      __assert_fail("spk_man != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xaca,
                    "void wallet::CWallet::GetKeyBirthTimes(std::map<CKeyID, int64_t> &) const");
    }
    local_b8._0_8_ = &(pLVar8->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore;
    local_b8._M_parent = (_Base_ptr)((ulong)local_b8._M_parent & 0xffffffffffffff00);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_b8);
    for (p_Var10 = (pLVar8->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header.
                   _M_header._M_left;
        (_Rb_tree_header *)p_Var10 !=
        &(pLVar8->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
      lVar2 = *(long *)(p_Var10 + 2);
      if (lVar2 != 0) {
        pmVar9 = std::
                 map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                 ::operator[](mapKeyBirth,(key_type *)(p_Var10 + 1));
        *pmVar9 = lVar2;
      }
    }
    (*(pLVar8->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x25])
              (local_108,pLVar8);
    if (p_Stack_f0 != (_Base_ptr)&pTStack_100) {
      p_Var10 = p_Stack_f0;
      do {
        cVar11 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                 ::find(&mapKeyBirth->_M_t,(key_type *)(p_Var10 + 1));
        if ((_Rb_tree_header *)cVar11._M_node == &(mapKeyBirth->_M_t)._M_impl.super__Rb_tree_header)
        {
          ppTVar12 = std::
                     map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                     ::operator[]((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                                   *)&local_68,(key_type *)(p_Var10 + 1));
          *ppTVar12 = &local_98;
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while (p_Var10 != (_Base_ptr)&pTStack_100);
    }
    std::
    _Rb_tree<CKeyID,_CKeyID,_std::_Identity<CKeyID>,_std::less<CKeyID>,_std::allocator<CKeyID>_>::
    ~_Rb_tree((_Rb_tree<CKeyID,_CKeyID,_std::_Identity<CKeyID>,_std::less<CKeyID>,_std::allocator<CKeyID>_>
               *)local_108);
    if (local_68._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_b8);
    }
    else {
      p_Var14 = (this->mapWallet)._M_h._M_before_begin._M_nxt;
      if (p_Var14 != (_Hash_node_base *)0x0) {
        do {
          if (*(char *)&p_Var14[0x3f]._M_nxt == '\0') {
            p_Var3 = p_Var14[0x38]._M_nxt[4]._M_nxt;
            for (p_Var15 = p_Var14[0x38]._M_nxt[3]._M_nxt; p_Var15 != p_Var3; p_Var15 = p_Var15 + 5)
            {
              GetAffectedKeys((vector<CKeyID,_std::allocator<CKeyID>_> *)local_108,
                              (CScript *)(p_Var15 + 1),
                              &(pLVar8->super_LegacyDataSPKM).super_FillableSigningProvider.
                               super_SigningProvider);
              pTVar5 = pTStack_100;
              for (__k = local_108; __k != (undefined1  [8])pTVar5;
                  __k = (undefined1  [8])
                        ((((TxStateConfirmed *)__k)->confirmed_block_hash).super_base_blob<256U>.
                         m_data._M_elems + 0x14)) {
                iVar13 = std::
                         _Rb_tree<CKeyID,_std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>,_std::_Select1st<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                         ::find(&local_68,(key_type *)__k);
                if (((_Rb_tree_header *)iVar13._M_node != &local_68._M_impl.super__Rb_tree_header)
                   && (*(int *)&p_Var14[0x3e]._M_nxt < (int)iVar13._M_node[1]._M_right[1]._M_color))
                {
                  iVar13._M_node[1]._M_right = (_Base_ptr)(p_Var14 + 0x3a);
                }
              }
              if (local_108 != (undefined1  [8])0x0) {
                operator_delete((void *)local_108,(long)p_Stack_f8 - (long)local_108);
              }
            }
          }
          p_Var14 = p_Var14->_M_nxt;
        } while (p_Var14 != (_Hash_node_base *)0x0);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_b8);
      if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_68._M_impl.super__Rb_tree_header) {
        p_Var10 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          pCVar4 = this->m_chain;
          if (pCVar4 == (Chain *)0x0) goto LAB_005192ee;
          p_Stack_f0 = (_Base_ptr)0x0;
          uStack_c8 = 0;
          local_c0 = 0;
          uStack_d8 = 0;
          local_d0 = 0;
          p_Stack_e8 = (_Base_ptr)0x0;
          local_e0 = 0;
          local_108 = (undefined1  [8])0x0;
          pTStack_100 = (TxStateConfirmed *)0x0;
          p_Stack_f8 = &local_b8;
          iVar7 = (*pCVar4->_vptr_Chain[10])(pCVar4,p_Var10[1]._M_right,local_108);
          local_109 = SUB41(iVar7,0);
          inline_check_non_fatal<bool>
                    (&local_109,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                     ,0xaf5,"GetKeyBirthTimes",
                     "chain().findBlock(entry.second->confirmed_block_hash, FoundBlock().time(block_time))"
                    );
          uVar6 = local_b8._0_8_;
          pmVar9 = std::
                   map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                   ::operator[](mapKeyBirth,(key_type *)(p_Var10 + 1));
          *pmVar9 = uVar6 + -0x1c20;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_68._M_impl.super__Rb_tree_header);
      }
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>,_std::_Select1st<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
    ::~_Rb_tree(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
LAB_005192ee:
  __assert_fail("m_chain",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
}

Assistant:

void CWallet::GetKeyBirthTimes(std::map<CKeyID, int64_t>& mapKeyBirth) const {
    AssertLockHeld(cs_wallet);
    mapKeyBirth.clear();

    // map in which we'll infer heights of other keys
    std::map<CKeyID, const TxStateConfirmed*> mapKeyFirstBlock;
    TxStateConfirmed max_confirm{uint256{}, /*height=*/-1, /*index=*/-1};
    max_confirm.confirmed_block_height = GetLastBlockHeight() > 144 ? GetLastBlockHeight() - 144 : 0; // the tip can be reorganized; use a 144-block safety margin
    CHECK_NONFATAL(chain().findAncestorByHeight(GetLastBlockHash(), max_confirm.confirmed_block_height, FoundBlock().hash(max_confirm.confirmed_block_hash)));

    {
        LegacyScriptPubKeyMan* spk_man = GetLegacyScriptPubKeyMan();
        assert(spk_man != nullptr);
        LOCK(spk_man->cs_KeyStore);

        // get birth times for keys with metadata
        for (const auto& entry : spk_man->mapKeyMetadata) {
            if (entry.second.nCreateTime) {
                mapKeyBirth[entry.first] = entry.second.nCreateTime;
            }
        }

        // Prepare to infer birth heights for keys without metadata
        for (const CKeyID &keyid : spk_man->GetKeys()) {
            if (mapKeyBirth.count(keyid) == 0)
                mapKeyFirstBlock[keyid] = &max_confirm;
        }

        // if there are no such keys, we're done
        if (mapKeyFirstBlock.empty())
            return;

        // find first block that affects those keys, if there are any left
        for (const auto& entry : mapWallet) {
            // iterate over all wallet transactions...
            const CWalletTx &wtx = entry.second;
            if (auto* conf = wtx.state<TxStateConfirmed>()) {
                // ... which are already in a block
                for (const CTxOut &txout : wtx.tx->vout) {
                    // iterate over all their outputs
                    for (const auto &keyid : GetAffectedKeys(txout.scriptPubKey, *spk_man)) {
                        // ... and all their affected keys
                        auto rit = mapKeyFirstBlock.find(keyid);
                        if (rit != mapKeyFirstBlock.end() && conf->confirmed_block_height < rit->second->confirmed_block_height) {
                            rit->second = conf;
                        }
                    }
                }
            }
        }
    }

    // Extract block timestamps for those keys
    for (const auto& entry : mapKeyFirstBlock) {
        int64_t block_time;
        CHECK_NONFATAL(chain().findBlock(entry.second->confirmed_block_hash, FoundBlock().time(block_time)));
        mapKeyBirth[entry.first] = block_time - TIMESTAMP_WINDOW; // block times can be 2h off
    }
}